

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,FRegList l)

{
  uint uVar1;
  char *pcVar2;
  ushort uVar3;
  undefined1 auVar4 [14];
  ushort uVar5;
  undefined1 auVar6 [14];
  int i;
  long lVar7;
  Fp fp;
  bool bVar8;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar9 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar16 [16];
  int r [8];
  undefined8 uStack_40;
  uint local_38 [8];
  
  lVar7 = 0;
  auVar9 = _DAT_00470b60;
  do {
    auVar13 = pshuflw(in_XMM4,auVar9,0xfe);
    auVar14 = pshuflw(auVar13,auVar9,0x54);
    iVar10 = auVar9._4_4_;
    iVar11 = auVar9._8_4_;
    iVar12 = auVar9._12_4_;
    auVar15._0_8_ = auVar9._8_8_;
    auVar15._8_4_ = iVar11;
    auVar15._12_4_ = iVar12;
    auVar16 = pshuflw(in_XMM7,auVar15,0xfe);
    uVar3 = l.raw >> auVar16._0_8_;
    auVar4._12_2_ = uVar3;
    auVar4._0_12_ = ZEXT212(l.raw >> auVar16._0_8_) << 0x40;
    in_XMM4 = pshuflw(auVar15,auVar15,0x54);
    uVar5 = l.raw >> in_XMM4._0_8_;
    auVar6._12_2_ = l.raw >> in_XMM4._0_8_;
    auVar6._0_12_ = ZEXT212(uVar5) << 0x40;
    in_XMM7._6_2_ = 0;
    in_XMM7._0_6_ = auVar6._8_6_;
    in_XMM7._8_6_ = auVar4._8_6_;
    in_XMM7._14_2_ = 0;
    local_38[lVar7] = l.raw >> auVar14._0_8_ & 1;
    local_38[lVar7 + 1] = l.raw >> auVar13._0_8_ & 1;
    local_38[lVar7 + 2] = uVar5 & 1;
    local_38[lVar7 + 3] = uVar3 & 1;
    lVar7 = lVar7 + 4;
    auVar9._0_4_ = auVar9._0_4_ + 4;
    auVar9._4_4_ = iVar10 + 4;
    auVar9._8_4_ = iVar11 + 4;
    auVar9._12_4_ = iVar12 + 4;
  } while (lVar7 != 8);
  lVar7 = 1;
  do {
    if (local_38[lVar7] != 0) {
      local_38[lVar7] = *(int *)((long)&uStack_40 + lVar7 * 4 + 4) + 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  lVar7 = 6;
  do {
    if ((local_38[lVar7] != 0) && (local_38[lVar7 + 1] != 0)) {
      local_38[lVar7] = local_38[lVar7 + 1];
    }
    bVar8 = lVar7 != 0;
    lVar7 = lVar7 + -1;
  } while (bVar8);
  bVar8 = true;
  fp.raw = 0;
  do {
    uVar1 = local_38[fp.raw];
    if (uVar1 != 0) {
      if (!bVar8) {
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = '/';
      }
      uStack_40 = 0x130c58;
      operator<<(this,fp);
      if (uVar1 != 1) {
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = '-';
        uStack_40 = 0x130c7b;
        operator<<(this,(Fp)(fp.raw + uVar1 + -1));
      }
      bVar8 = false;
    }
    fp.raw = fp.raw + uVar1 + 1;
  } while (fp.raw < 8);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(FRegList l)
{
    int r[8];

    // Step 1: Fill array r with the register list bits, e.g., 11101101
    for (int i = 0; i <= 7; i++) { r[i] = !!(l.raw & (1 << i)); }

    // Step 2: Convert 11101101 to 12301201
    for (int i = 1; i <= 7; i++) { if (r[i]) r[i] = r[i-1] + 1; }

    // Step 3: Convert 12301201 to 33302201
    for (int i = 6; i >= 0; i--) { if (r[i] && r[i+1]) r[i] = r[i+1]; }

    // Step 4: Convert 33302201 to "FP0-FP2/FP4/FP5/FP7"
    bool first = true;
    for (int i = 0; i <= 7; i += r[i] + 1) {

        if (r[i] == 0) continue;

        // Print delimiter
        if (first) { first = false; } else { *this << "/"; }

        // Format variant 1: Single register
        if (r[i] == 1) { *this << Fp{i}; }

        // Format variant 2: Register range
        else { *this << Fp{i} << "-" << Fp{i+r[i]-1}; }
    }

    return *this;
}